

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFFPdu.cpp
# Opt level: O3

int __thiscall DIS::IFFPdu::getMarshalledSize(IFFPdu *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  pointer pIVar10;
  ulong uVar11;
  long lVar12;
  IFFFundamentalParameterData listElement;
  IFFFundamentalParameterData local_50;
  
  iVar1 = DistributedEmissionsFamilyPdu::getMarshalledSize
                    (&this->super_DistributedEmissionsFamilyPdu);
  iVar2 = EntityID::getMarshalledSize(&this->_emittingEntityID);
  iVar3 = EventIdentifier::getMarshalledSize(&this->_eventID);
  iVar4 = Vector3Float::getMarshalledSize(&this->_relativeAntennaLocation);
  iVar5 = SystemIdentifier::getMarshalledSize(&this->_systemID);
  iVar6 = FundamentalOperationalData::getMarshalledSize(&this->_fundamentalOperationalData);
  iVar7 = LayerHeader::getMarshalledSize(&this->_layerHeader);
  iVar8 = BeamData::getMarshalledSize(&this->_beamData);
  iVar9 = SecondaryOperationalData::getMarshalledSize(&this->_secondaryOperationalData);
  iVar1 = iVar9 + iVar6 + iVar5 + iVar7 + iVar4 + iVar3 + iVar2 + iVar1 + iVar8 + 3;
  pIVar10 = (this->_iffParameters).
            super__Vector_base<DIS::IFFFundamentalParameterData,_std::allocator<DIS::IFFFundamentalParameterData>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->_iffParameters).
      super__Vector_base<DIS::IFFFundamentalParameterData,_std::allocator<DIS::IFFFundamentalParameterData>_>
      ._M_impl.super__Vector_impl_data._M_finish != pIVar10) {
    lVar12 = 8;
    uVar11 = 0;
    do {
      local_50._vptr_IFFFundamentalParameterData =
           (_func_int **)&PTR__IFFFundamentalParameterData_001b4e18;
      local_50._24_8_ = *(undefined8 *)(pIVar10->_systemSpecificData + lVar12 + -0xd);
      local_50._8_8_ = *(undefined8 *)(pIVar10->_systemSpecificData + lVar12 + -0x1d);
      local_50._16_8_ = *(undefined8 *)(pIVar10->_systemSpecificData + lVar12 + -0x1d + 8);
      iVar2 = IFFFundamentalParameterData::getMarshalledSize(&local_50);
      iVar1 = iVar1 + iVar2;
      IFFFundamentalParameterData::~IFFFundamentalParameterData(&local_50);
      uVar11 = uVar11 + 1;
      pIVar10 = (this->_iffParameters).
                super__Vector_base<DIS::IFFFundamentalParameterData,_std::allocator<DIS::IFFFundamentalParameterData>_>
                ._M_impl.super__Vector_impl_data._M_start;
      lVar12 = lVar12 + 0x20;
    } while (uVar11 < (ulong)((long)(this->_iffParameters).
                                    super__Vector_base<DIS::IFFFundamentalParameterData,_std::allocator<DIS::IFFFundamentalParameterData>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pIVar10 >> 5)
            );
  }
  return iVar1;
}

Assistant:

int IFFPdu::getMarshalledSize() const
{
    int marshalSize = 0;

    marshalSize = DistributedEmissionsFamilyPdu::getMarshalledSize();
    marshalSize = marshalSize + _emittingEntityID.getMarshalledSize();  // _emittingEntityID
    marshalSize = marshalSize + _eventID.getMarshalledSize();  // _eventID
    marshalSize = marshalSize + _relativeAntennaLocation.getMarshalledSize(); //_relativeAntennaLocation
    marshalSize = marshalSize + 1;  // _numberOfIFFParameters
    marshalSize = marshalSize + _systemID.getMarshalledSize(); //_systemID
    marshalSize = marshalSize + 1; //_systemDesignator
    marshalSize = marshalSize + 1; //_systemSpecificData
    marshalSize = marshalSize + _fundamentalOperationalData.getMarshalledSize();  // _fundamentalOperationalData
    marshalSize = marshalSize + _layerHeader.getMarshalledSize();  // _layerHeader
    marshalSize = marshalSize + _beamData.getMarshalledSize();  // _beamData
    marshalSize = marshalSize + _secondaryOperationalData.getMarshalledSize();  // _secondaryOperationalData

    for(unsigned long long idx=0; idx < _iffParameters.size(); idx++)
    {
        IFFFundamentalParameterData listElement = _iffParameters[idx];
        marshalSize = marshalSize + listElement.getMarshalledSize();
    }

    return marshalSize;
}